

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  long lVar1;
  PyCodeObject *pPVar2;
  string *in_RDI;
  PyFrameObject *b_frame;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  handle local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  int local_dc;
  PyObject *pPStack_d8;
  int lineno;
  PyCodeObject *f_code;
  PyFrameObject *frame;
  PyTracebackObject *trace;
  str local_b8;
  string local_b0;
  handle local_90;
  str_attr_accessor local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_41;
  undefined1 local_40 [8];
  error_scope scope;
  allocator<char> local_11 [9];
  string *errorString;
  
  lVar1 = PyErr_Occurred();
  if (lVar1 == 0) {
    PyErr_SetString(_PyExc_RuntimeError);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"Unknown internal error occurred",local_11);
    std::allocator<char>::~allocator(local_11);
  }
  else {
    error_scope::error_scope((error_scope *)local_40);
    local_41 = 0;
    std::__cxx11::string::string((string *)in_RDI);
    if (local_40 != (undefined1  [8])0x0) {
      handle::handle(&local_90,(PyObject *)local_40);
      object_api<pybind11::handle>::attr
                (&local_88,(object_api<pybind11::handle> *)&local_90,"__name__");
      accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                (&local_68,&local_88);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_88);
      std::__cxx11::string::operator+=((string *)in_RDI,": ");
    }
    if (scope.type != (PyObject *)0x0) {
      handle::handle((handle *)&trace,scope.type);
      str::str(&local_b8,(handle)trace);
      str::operator_cast_to_string(&local_b0,&local_b8);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      str::~str(&local_b8);
    }
    PyErr_NormalizeException(local_40,&scope,&scope.value);
    if (scope.value != (PyObject *)0x0) {
      PyException_SetTraceback(scope.type,scope.value);
    }
    if (scope.value != (PyObject *)0x0) {
      for (frame = (PyFrameObject *)scope.value; (frame->ob_base).ob_size != 0;
          frame = (PyFrameObject *)(frame->ob_base).ob_size) {
      }
      f_code = (PyCodeObject *)frame->f_back;
      _Py_XINCREF((PyObject *)f_code);
      std::__cxx11::string::operator+=((string *)in_RDI,"\n\nAt:\n");
      while (f_code != (PyCodeObject *)0x0) {
        pPStack_d8 = (PyObject *)PyFrame_GetCode(f_code);
        local_dc = PyFrame_GetLineNumber(f_code);
        handle::handle(&local_1c8,(PyObject *)pPStack_d8[6].ob_type);
        handle::cast<std::__cxx11::string>(&local_1c0,&local_1c8);
        std::operator+(&local_1a0,"  ",&local_1c0);
        std::operator+(&local_180,&local_1a0,"(");
        std::__cxx11::to_string(&local_1e8,local_dc);
        std::operator+(&local_160,&local_180,&local_1e8);
        std::operator+(&local_140,&local_160,"): ");
        handle::handle((handle *)&b_frame,(PyObject *)pPStack_d8[7].ob_refcnt);
        handle::cast<std::__cxx11::string>(&local_208,(handle *)&b_frame);
        std::operator+(&local_120,&local_140,&local_208);
        std::operator+(&local_100,&local_120,"\n");
        std::__cxx11::string::operator+=((string *)in_RDI,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        _Py_DECREF(pPStack_d8);
        pPVar2 = (PyCodeObject *)PyFrame_GetBack(f_code);
        _Py_DECREF(&f_code->ob_base);
        f_code = pPVar2;
      }
    }
    local_41 = 1;
    error_scope::~error_scope((error_scope *)local_40);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value) {
        errorString += (std::string) str(scope.value);
    }

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr) {
        PyException_SetTraceback(scope.value, scope.trace);
    }
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        auto *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next) {
            trace = trace->tb_next;
        }

        PyFrameObject *frame = trace->tb_frame;
        Py_XINCREF(frame);
        errorString += "\n\nAt:\n";
        while (frame) {
#    if PY_VERSION_HEX >= 0x030900B1
            PyCodeObject *f_code = PyFrame_GetCode(frame);
#    else
            PyCodeObject *f_code = frame->f_code;
            Py_INCREF(f_code);
#    endif
            int lineno = PyFrame_GetLineNumber(frame);
            errorString += "  " + handle(f_code->co_filename).cast<std::string>() + "("
                           + std::to_string(lineno)
                           + "): " + handle(f_code->co_name).cast<std::string>() + "\n";
            Py_DECREF(f_code);
#    if PY_VERSION_HEX >= 0x030900B1
            auto *b_frame = PyFrame_GetBack(frame);
#    else
            auto *b_frame = frame->f_back;
            Py_XINCREF(b_frame);
#    endif
            Py_DECREF(frame);
            frame = b_frame;
        }
    }
#endif

    return errorString;
}